

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> * unicode_cpt_flags_array(void)

{
  unicode_cpt_flags uVar1;
  uint uVar2;
  vector<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_> *in_RAX;
  unicode_cpt_flags *__cur;
  pointer puVar3;
  __node_base _Var4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (pointer)operator_new(0x220000);
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + 0x110000;
  lVar6 = 0;
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  unicode_cpt_flags_from_cpt::cpt_flags.
  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       unicode_cpt_flags_from_cpt::cpt_flags.
       super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
       super__Vector_impl_data._M_finish;
  do {
    *(undefined8 *)(puVar3 + lVar6) = 0x1000100010001;
    *(undefined8 *)(puVar3 + lVar6 + 4) = 0x1000100010001;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x110000);
  uVar5 = 1;
  do {
    uVar7 = (ulong)*(uint *)("18llm_tokenizer_rwkv" + uVar5 * 8 + 0xf);
    uVar2 = (&_ZGR20unicode_ranges_flags_)[uVar5 * 2];
    if (*(uint *)("18llm_tokenizer_rwkv" + uVar5 * 8 + 0xf) < uVar2) {
      uVar1 = *(unicode_cpt_flags *)("18llm_tokenizer_rwkv" + uVar5 * 8 + 0x13);
      do {
        unicode_cpt_flags_from_cpt::cpt_flags.
        super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = uVar1;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    uVar5 = uVar5 + 1;
    _Var4._M_nxt = unicode_set_whitespace._M_h._M_before_begin._M_nxt;
  } while (uVar5 < 0x8e1);
  for (; _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    unicode_cpt_flags_from_cpt::cpt_flags.
    super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)&_Var4._M_nxt[1]._M_nxt] =
         (unicode_cpt_flags)
         ((ushort)unicode_cpt_flags_from_cpt::cpt_flags.
                  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
                  super__Vector_impl_data._M_start[*(uint *)&_Var4._M_nxt[1]._M_nxt] | 0x100);
  }
  lVar6 = 0;
  do {
    unicode_cpt_flags_from_cpt::cpt_flags.
    super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)((long)&DAT_00243ca4 + lVar6)] =
         (unicode_cpt_flags)
         ((ushort)unicode_cpt_flags_from_cpt::cpt_flags.
                  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
                  super__Vector_impl_data._M_start[*(uint *)((long)&DAT_00243ca4 + lVar6)] | 0x200);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x2cc8);
  lVar6 = 0;
  do {
    unicode_cpt_flags_from_cpt::cpt_flags.
    super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)(_ZGR21unicode_map_uppercase_ + lVar6 + 4)] =
         (unicode_cpt_flags)
         ((ushort)unicode_cpt_flags_from_cpt::cpt_flags.
                  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [*(uint *)(_ZGR21unicode_map_uppercase_ + lVar6 + 4)] | 0x400);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x2d50);
  lVar6 = 0;
  do {
    unicode_cpt_flags_from_cpt::cpt_flags.
    super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)(_ZGR18unicode_ranges_nfd_ + lVar6 + 8)] =
         (unicode_cpt_flags)
         ((ushort)unicode_cpt_flags_from_cpt::cpt_flags.
                  super__Vector_base<unicode_cpt_flags,_std::allocator<unicode_cpt_flags>_>._M_impl.
                  super__Vector_impl_data._M_start[*(uint *)(_ZGR18unicode_ranges_nfd_ + lVar6 + 8)]
         | 0x800);
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x55b0);
  return in_RAX;
}

Assistant:

static std::vector<unicode_cpt_flags> unicode_cpt_flags_array() {
    std::vector<unicode_cpt_flags> cpt_flags(MAX_CODEPOINTS, unicode_cpt_flags::UNDEFINED);

    assert (unicode_ranges_flags.begin()[0].first == 0);
    assert (unicode_ranges_flags.begin()[unicode_ranges_flags.size()-1].first == MAX_CODEPOINTS);
    for (size_t i = 1; i < unicode_ranges_flags.size(); ++i) {
        const auto range_ini = unicode_ranges_flags.begin()[i-1];  // codepoint_ini, flags
        const auto range_end = unicode_ranges_flags.begin()[i];    // codepoint_end, flags
        for (uint32_t cpt = range_ini.first; cpt < range_end.first; ++cpt) {
            cpt_flags[cpt] = range_ini.second;
        }
    }

    for (auto cpt : unicode_set_whitespace) {
        cpt_flags[cpt].is_whitespace = true;
    }

    for (auto p : unicode_map_lowercase) {
        cpt_flags[p.second].is_lowercase = true;
    }

    for (auto p : unicode_map_uppercase) {
        cpt_flags[p.second].is_uppercase = true;
    }

    for (auto &range : unicode_ranges_nfd) {  // start, last, nfd
        cpt_flags[range.nfd].is_nfd = true;
    }

    return cpt_flags;
}